

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.h
# Opt level: O3

void __thiscall runner::operator()(runner *this)

{
  int iVar1;
  
  iVar1 = std::__cxx11::string::compare((char *)&this->command_);
  if (iVar1 != 0) {
    iVar1 = system((this->command_)._M_dataplus._M_p);
    run_ok = iVar1 == 0;
    cppcms::service::shutdown();
    return;
  }
  return;
}

Assistant:

void operator()() const
	{
		if(command_ != "none") {
			run_ok = ::system(command_.c_str()) == 0;
			srv_->shutdown();	
		}
	}